

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::option_syntax_exception::~option_syntax_exception(option_syntax_exception *this)

{
  option_syntax_exception *this_local;
  
  ~option_syntax_exception(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit option_syntax_exception(const std::string& text)
    : OptionParseException("Argument " + LQUOTE + text + RQUOTE +
        " starts with a - but has incorrect syntax")
    {
    }